

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlk.cpp
# Opt level: O3

UnicodeString * __thiscall icu_63::LocaleKey::currentID(LocaleKey *this,UnicodeString *result)

{
  ushort uVar1;
  int32_t srcLength;
  
  uVar1 = (this->_currentID).fUnion.fStackFields.fLengthAndFlags;
  if ((uVar1 & 1) == 0) {
    if ((short)uVar1 < 0) {
      srcLength = (this->_currentID).fUnion.fFields.fLength;
    }
    else {
      srcLength = (int)(short)uVar1 >> 5;
    }
    UnicodeString::doAppend(result,&this->_currentID,0,srcLength);
  }
  return result;
}

Assistant:

UnicodeString&
LocaleKey::currentID(UnicodeString& result) const {
    if (!_currentID.isBogus()) {
        result.append(_currentID);
    }
    return result;
}